

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall capnp::compiler::NodeTranslator::StructLayout::Group::addMember(Group *this)

{
  if (this->hasMembers != false) {
    return;
  }
  this->hasMembers = true;
  Union::newGroupAddingFirstMember(this->parent);
  return;
}

Assistant:

void addMember() {
      if (!hasMembers) {
        hasMembers = true;
        parent.newGroupAddingFirstMember();
      }
    }